

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::ScopedTrace::PushTrace(ScopedTrace *this,char *file,int line,string *message)

{
  TraceInfo trace;
  undefined1 local_40 [16];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_40._0_8_ = file;
  local_40._8_4_ = line;
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::swap((string *)&local_30);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}